

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_sink.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::CodeSinkingPass::SinkInstructionsInBB(CodeSinkingPass *this,BasicBlock *bb)

{
  bool bVar1;
  reference inst_00;
  undefined1 local_38 [16];
  undefined1 local_28 [8];
  reverse_iterator inst;
  bool modified;
  BasicBlock *bb_local;
  CodeSinkingPass *this_local;
  
  inst.current.super_iterator.node_._7_1_ = 0;
  BasicBlock::rbegin((BasicBlock *)local_28);
  while( true ) {
    BasicBlock::rend((BasicBlock *)(local_38 + 8));
    bVar1 = std::operator!=((reverse_iterator<spvtools::opt::InstructionList::iterator> *)local_28,
                            (reverse_iterator<spvtools::opt::InstructionList::iterator> *)
                            (local_38 + 8));
    if (!bVar1) break;
    inst_00 = std::reverse_iterator<spvtools::opt::InstructionList::iterator>::operator*
                        ((reverse_iterator<spvtools::opt::InstructionList::iterator> *)local_28);
    bVar1 = SinkInstruction(this,inst_00);
    if (bVar1) {
      BasicBlock::rbegin((BasicBlock *)local_38);
      std::reverse_iterator<spvtools::opt::InstructionList::iterator>::operator=
                ((reverse_iterator<spvtools::opt::InstructionList::iterator> *)local_28,
                 (reverse_iterator<spvtools::opt::InstructionList::iterator> *)local_38);
      inst.current.super_iterator.node_._7_1_ = 1;
    }
    std::reverse_iterator<spvtools::opt::InstructionList::iterator>::operator++
              ((reverse_iterator<spvtools::opt::InstructionList::iterator> *)local_28);
  }
  return (bool)(inst.current.super_iterator.node_._7_1_ & 1);
}

Assistant:

bool CodeSinkingPass::SinkInstructionsInBB(BasicBlock* bb) {
  bool modified = false;
  for (auto inst = bb->rbegin(); inst != bb->rend(); ++inst) {
    if (SinkInstruction(&*inst)) {
      inst = bb->rbegin();
      modified = true;
    }
  }
  return modified;
}